

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBlockCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_f5b99d::cmBlockFunctionBlocker::Replay
          (cmBlockFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus)

{
  cmMakefile *makefile;
  pointer pcVar1;
  bool bVar2;
  pointer lff;
  cmExecutionStatus status;
  cmExecutionStatus local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  makefile = inStatus->Makefile;
  lff = (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>).
        _M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (lff == pcVar1) {
      return true;
    }
    cmExecutionStatus::cmExecutionStatus(&local_c0,makefile);
    local_58._M_engaged = false;
    cmMakefile::ExecuteCommand
              (makefile,lff,&local_c0,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_58);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_58);
    if (local_c0.ReturnInvoked == true) break;
    if (local_c0.BreakInvoked == true) {
      inStatus->BreakInvoked = true;
      goto LAB_0035d7ed;
    }
    if (local_c0.ContinueInvoked == true) {
      inStatus->ContinueInvoked = true;
      goto LAB_0035d7ed;
    }
    if (local_c0.ExitCode.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged == true) {
      (inStatus->ExitCode).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int> =
           (_Optional_payload_base<int>)
           ((ulong)(uint)local_c0.ExitCode.super__Optional_base<int,_true,_true>._M_payload.
                         super__Optional_payload_base<int>._M_payload._M_value | 0x100000000);
      goto LAB_0035d7ed;
    }
    bVar2 = cmSystemTools::GetFatalErrorOccurred();
    cmExecutionStatus::~cmExecutionStatus(&local_c0);
    lff = lff + 1;
    if (bVar2) {
      return true;
    }
  }
  cmMakefile::RaiseScope(makefile,&local_c0.Variables);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_70,&local_c0.Variables);
  cmExecutionStatus::SetReturnInvoked(inStatus,&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
LAB_0035d7ed:
  cmExecutionStatus::~cmExecutionStatus(&local_c0);
  return true;
}

Assistant:

bool cmBlockFunctionBlocker::Replay(std::vector<cmListFileFunction> functions,
                                    cmExecutionStatus& inStatus)
{
  auto& mf = inStatus.GetMakefile();

  // Invoke all the functions that were collected in the block.
  for (cmListFileFunction const& fn : functions) {
    cmExecutionStatus status(mf);
    mf.ExecuteCommand(fn, status);
    if (status.GetReturnInvoked()) {
      mf.RaiseScope(status.GetReturnVariables());
      inStatus.SetReturnInvoked(status.GetReturnVariables());
      return true;
    }
    if (status.GetBreakInvoked()) {
      inStatus.SetBreakInvoked();
      return true;
    }
    if (status.GetContinueInvoked()) {
      inStatus.SetContinueInvoked();
      return true;
    }
    if (status.HasExitCode()) {
      inStatus.SetExitCode(status.GetExitCode());
      return true;
    }
    if (cmSystemTools::GetFatalErrorOccurred()) {
      return true;
    }
  }
  return true;
}